

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001c0ff0 = 0x2e2e2e2e2e2e2e;
    uRam00000000001c0ff7 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001c0fe0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001c0fe8 = 0x2e2e2e2e2e2e2e;
    DAT_001c0fef = 0x2e;
    _DAT_001c0fd0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001c0fd8 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001c0fc0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001c0fc8 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001c0fb8 = 0x2e2e2e2e2e2e2e2e;
    DAT_001c0fff = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }